

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_lib_shutdown(void)

{
  unqlite *puVar1;
  jx9 *pjVar2;
  unqlite *pDb;
  jx9 *pEngine;
  
  pDb = sUnqlMPGlobal.pDB;
  if (sUnqlMPGlobal.nMagic == 0xea1495ba) {
    for (; 0 < sUnqlMPGlobal.nDB; sUnqlMPGlobal.nDB = sUnqlMPGlobal.nDB + -1) {
      puVar1 = pDb->pNext;
      unqliteDbRelease(pDb);
      pDb = puVar1;
    }
    SySetRelease(&sUnqlMPGlobal.kv_storage);
    if (sUnqlMPGlobal.sAllocator.pMethods != (SyMemMethods *)0x0) {
      SyMemBackendRelease(&sUnqlMPGlobal.sAllocator);
    }
    sUnqlMPGlobal.nMagic = 0x1764;
    pEngine = sJx9MPGlobal.pEngines;
    if (sJx9MPGlobal.nMagic == 0xea1495ba) {
      for (; 0 < sJx9MPGlobal.nEngine; sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + -1) {
        pjVar2 = pEngine->pNext;
        EngineRelease(pEngine);
        pEngine = pjVar2;
      }
      if (sJx9MPGlobal.sAllocator.pMethods != (SyMemMethods *)0x0) {
        SyMemBackendRelease(&sJx9MPGlobal.sAllocator);
      }
      sJx9MPGlobal.nMagic = 0x1928;
    }
  }
  return 0;
}

Assistant:

int unqlite_lib_shutdown(void)
{
	if( sUnqlMPGlobal.nMagic != UNQLITE_LIB_MAGIC ){
		/* Already shut */
		return UNQLITE_OK;
	}
	unqliteCoreShutdown();
	return UNQLITE_OK;
}